

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O1

int slu_mmdupd_(int_t *ehead,int *neqns,int_t *xadj,shortint *adjncy,int_t *delta,int_t *mdeg,
               shortint *dhead,int *dforw,int *dbakw,shortint *qsize,shortint *llist,
               shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint local_5c;
  uint local_50;
  int local_4c;
  
  local_50 = *ehead;
  if ((int)local_50 < 1) {
    return 0;
  }
  iVar1 = *delta;
  iVar2 = *mdeg;
LAB_0011b74a:
  local_4c = *tag + iVar1 + iVar2;
  if (*maxint <= local_4c) {
    *tag = 1;
    uVar15 = *neqns;
    if (0 < (int)uVar15) {
      uVar7 = 0;
      do {
        if (marker[uVar7] < *maxint) {
          marker[uVar7] = 0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
    }
    local_4c = *tag + iVar1 + iVar2;
  }
  uVar5 = (ulong)local_50;
  iVar9 = xadj[uVar5 - 1];
  iVar10 = xadj[uVar5];
  uVar7 = 0;
  local_5c = 0;
  iVar12 = 0;
  if (iVar9 < iVar10) {
    iVar12 = 0;
    local_5c = 0;
    uVar7 = 0;
    do {
      lVar8 = (long)iVar9;
      while( true ) {
        uVar14 = (uint)uVar7;
        uVar15 = adjncy[lVar8 + -1];
        lVar11 = (long)(int)uVar15;
        if (lVar11 < 0) break;
        if (uVar15 == 0) goto LAB_0011b868;
        if (qsize[lVar11 + -1] != 0) {
          iVar12 = qsize[lVar11 + -1] + iVar12;
          marker[lVar11 + -1] = local_4c;
          if (dbakw[lVar11 + -1] == 0) {
            if (dforw[lVar11 + -1] == 2) {
              uVar7 = (ulong)uVar15;
              uVar15 = local_5c;
              local_5c = uVar14;
            }
            llist[lVar11 + -1] = local_5c;
            local_5c = uVar15;
          }
        }
        lVar8 = lVar8 + 1;
        if (iVar10 <= lVar8) goto LAB_0011b868;
      }
      iVar9 = xadj[(ulong)-uVar15 - 1];
      iVar10 = xadj[-uVar15];
    } while (iVar9 < iVar10);
  }
LAB_0011b868:
  uVar14 = (uint)uVar7;
  uVar15 = local_5c;
  iVar9 = iVar12;
  if ((int)uVar14 < 1) goto LAB_0011b9b6;
  bVar4 = true;
  if (dbakw[uVar7 - 1] != 0) goto LAB_0011bacf;
  *tag = *tag + 1;
  uVar15 = adjncy[(long)xadj[uVar7 - 1] + -1];
  if (uVar15 == local_50) {
    uVar15 = adjncy[xadj[uVar7 - 1]];
  }
  lVar8 = (long)(int)uVar15;
  if (dforw[lVar8 + -1] < 0) {
    iVar10 = xadj[lVar8 + -1];
    iVar6 = xadj[lVar8];
    bVar4 = true;
    if (iVar10 < iVar6) {
LAB_0011b8e4:
      lVar8 = (long)iVar10;
      do {
        uVar15 = adjncy[lVar8 + -1];
        uVar13 = (ulong)uVar15;
        if (uVar15 != uVar14) {
          if ((int)uVar15 < 0) goto LAB_0011b99d;
          if (uVar13 == 0) break;
          if (qsize[uVar13 - 1] != 0) {
            if (marker[uVar13 - 1] < *tag) {
              marker[uVar13 - 1] = *tag;
              iVar9 = iVar9 + qsize[uVar13 - 1];
            }
            else if (dbakw[uVar13 - 1] == 0) {
              if (dforw[uVar13 - 1] == 2) {
                qsize[uVar7 - 1] = qsize[uVar7 - 1] + qsize[uVar13 - 1];
                qsize[uVar13 - 1] = 0;
                marker[uVar13 - 1] = *maxint;
                dforw[uVar13 - 1] = -uVar14;
              }
              dbakw[uVar13 - 1] = -*maxint;
            }
          }
        }
        lVar8 = lVar8 + 1;
        if (iVar6 <= lVar8) break;
      } while( true );
    }
  }
  else {
    bVar4 = true;
    iVar9 = qsize[lVar8 + -1] + iVar12;
  }
LAB_0011ba7c:
  do {
    lVar8 = (long)iVar9 - (long)qsize[uVar7 - 1];
    iVar10 = (uint)lVar8 + 1;
    iVar9 = dhead[lVar8];
    dforw[uVar7 - 1] = iVar9;
    dbakw[uVar7 - 1] = ~(uint)lVar8;
    if (0 < (long)iVar9) {
      dbakw[(long)iVar9 + -1] = (shortint)uVar7;
    }
    dhead[lVar8] = (shortint)uVar7;
    if (iVar10 < *mdeg) {
      *mdeg = iVar10;
    }
LAB_0011bacf:
    while( true ) {
      uVar15 = llist[uVar7 - 1];
      uVar7 = (ulong)uVar15;
      if (bVar4) goto LAB_0011b868;
LAB_0011b9b6:
      if ((int)uVar15 < 1) {
        *tag = local_4c;
        local_50 = llist[uVar5 - 1];
        if ((int)local_50 < 1) {
          return 0;
        }
        goto LAB_0011b74a;
      }
      bVar4 = false;
      if (dbakw[(ulong)uVar15 - 1] == 0) break;
      uVar7 = (ulong)uVar15;
    }
    *tag = *tag + 1;
    lVar8 = (long)xadj[(ulong)uVar15 - 1];
    iVar10 = xadj[uVar15];
    bVar4 = false;
    iVar9 = iVar12;
    if (iVar10 <= xadj[(ulong)uVar15 - 1]) {
      uVar7 = (ulong)uVar15;
      goto LAB_0011ba7c;
    }
    do {
      uVar7 = (ulong)adjncy[lVar8 + -1];
      if (uVar7 == 0) break;
      if (marker[uVar7 - 1] < *tag) {
        marker[uVar7 - 1] = *tag;
        if (dforw[uVar7 - 1] < 0) {
          while( true ) {
            iVar6 = xadj[uVar7];
            if (iVar6 <= xadj[uVar7 - 1]) break;
            lVar11 = (long)xadj[uVar7 - 1];
            while( true ) {
              iVar3 = adjncy[lVar11 + -1];
              lVar16 = (long)iVar3;
              if (lVar16 < 0) break;
              if (iVar3 == 0) goto LAB_0011ba5d;
              if (marker[lVar16 + -1] < *tag) {
                marker[lVar16 + -1] = *tag;
                iVar9 = iVar9 + qsize[lVar16 + -1];
              }
              lVar11 = lVar11 + 1;
              if (iVar6 <= lVar11) goto LAB_0011ba5d;
            }
            uVar7 = (ulong)(uint)-iVar3;
          }
        }
        else {
          iVar9 = iVar9 + qsize[uVar7 - 1];
        }
      }
LAB_0011ba5d:
      lVar8 = lVar8 + 1;
    } while (iVar10 != (int)lVar8);
    uVar7 = (ulong)uVar15;
  } while( true );
LAB_0011b99d:
  iVar10 = xadj[(ulong)-uVar15 - 1];
  iVar6 = xadj[-uVar15];
  if (iVar6 <= iVar10) goto LAB_0011ba7c;
  goto LAB_0011b8e4;
}

Assistant:

int slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt, 
	    istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
	return 0;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
	goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	enode = adjncy[i];
	link = -enode;
	if (enode < 0) {
	    goto L400;
	} else if (enode == 0) {
	    goto L800;
	} else {
	    goto L500;
	}

L500:
	if (qsize[enode] == 0) {
	    goto L700;
	}
	deg0 += qsize[enode];
	marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
	if (dbakw[enode] != 0) {
	    goto L700;
	}
/*                            --------------------------------------- 
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS. 
*/
/*                            --------------------------------------- 
*/
	if (dforw[enode] == 2) {
	    goto L600;
	}
	llist[enode] = qxhead;
	qxhead = enode;
	goto L700;
L600:
	llist[enode] = q2head;
	q2head = enode;
L700:
	;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
	goto L1500;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
	nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
	goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	node = adjncy[i];
	link = -node;
	if (node == enode) {
	    goto L1400;
	}
	if (node < 0) {
	    goto L1000;
	} else if (node == 0) {
	    goto L2100;
	} else {
	    goto L1100;
	}

L1100:
	if (qsize[node] == 0) {
	    goto L1400;
	}
	if (marker[node] >= *tag) {
	    goto L1200;
	}
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
	marker[node] = *tag;
	deg += qsize[node];
	goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
	if (dbakw[node] != 0) {
	    goto L1400;
	}
	if (dforw[node] != 2) {
	    goto L1300;
	}
	qsize[enode] += qsize[node];
	qsize[node] = 0;
	marker[node] = *maxint;
	dforw[node] = -enode;
	dbakw[node] = -(*maxint);
	goto L1400;
L1300:
/*                            -------------------------------------- 
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE. 
*/
/*                            -------------------------------------- 
*/
	if (dbakw[node] == 0) {
	    dbakw[node] = -(*maxint);
	}
L1400:
	;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
	goto L2300;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L2100;
	}
	if (marker[nabor] >= *tag) {
	    goto L2000;
	}
	marker[nabor] = *tag;
	link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
	if (dforw[nabor] < 0) {
	    goto L1700;
	}
	deg += qsize[nabor];
	goto L2000;
L1700:
/*                                    ------------------------------- 
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED 
*/
/*                                    NODES IN THIS ELEMENT INTO THE 
*/
/*                                    DEGREE COUNT. */
/*                                    ------------------------------- 
*/
	jstrt = xadj[link];
	jstop = xadj[link + 1] - 1;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    node = adjncy[j];
	    link = -node;
	    if (node < 0) {
		goto L1700;
	    } else if (node == 0) {
		goto L2000;
	    } else {
		goto L1800;
	    }

L1800:
	    if (marker[node] >= *tag) {
		goto L1900;
	    }
	    marker[node] = *tag;
	    deg += qsize[node];
L1900:
	    ;
	}
L2000:
	;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
	dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
	*mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
	goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}